

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O0

size_t tinyusdz::anon_unknown_0::_DecodeIntegers<long>(char *data,size_t numInts,long *result)

{
  long *local_50;
  size_t intsLeft;
  SInt prevVal;
  char *vintsIn;
  char *codesIn;
  size_t numCodesBytes;
  long commonValue;
  long *result_local;
  size_t numInts_local;
  char *data_local;
  
  commonValue = (long)result;
  result_local = (long *)numInts;
  numInts_local = (size_t)data;
  numCodesBytes = _ReadBits<long>((char **)&numInts_local);
  codesIn = (char *)((long)result_local * 2 + 7U >> 3);
  vintsIn = (char *)numInts_local;
  prevVal = (SInt)(codesIn + numInts_local);
  intsLeft = 0;
  for (local_50 = result_local; (long *)0x3 < local_50; local_50 = (long *)((long)local_50 - 4)) {
    (anonymous_namespace)::_DecodeNHelper<4,long*>
              (&vintsIn,(char **)&prevVal,numCodesBytes,(type *)&intsLeft,(long **)&commonValue);
  }
  switch(local_50) {
  case (long *)0x0:
    break;
  case (long *)0x1:
    (anonymous_namespace)::_DecodeNHelper<1,long*>
              (&vintsIn,(char **)&prevVal,numCodesBytes,(type *)&intsLeft,(long **)&commonValue);
    break;
  case (long *)0x2:
    (anonymous_namespace)::_DecodeNHelper<2,long*>
              (&vintsIn,(char **)&prevVal,numCodesBytes,(type *)&intsLeft,(long **)&commonValue);
    break;
  case (long *)0x3:
    (anonymous_namespace)::_DecodeNHelper<3,long*>
              (&vintsIn,(char **)&prevVal,numCodesBytes,(type *)&intsLeft,(long **)&commonValue);
  }
  return (size_t)result_local;
}

Assistant:

size_t _DecodeIntegers(char const *data, size_t numInts, Int *result)
{
    using SInt = typename std::make_signed<Int>::type;

    auto commonValue = _ReadBits<SInt>(data);

    size_t numCodesBytes = (numInts * 2 + 7) / 8;
    char const *codesIn = data;
    char const *vintsIn = data + numCodesBytes;

    SInt prevVal = 0;
    auto intsLeft = numInts;
    while (intsLeft >= 4) {
        _DecodeNHelper<4>(codesIn, vintsIn, commonValue, prevVal, result);
        intsLeft -= 4;
    }
    switch (intsLeft) {
    case 0: default: break;
    case 1: _DecodeNHelper<1>(codesIn, vintsIn, commonValue, prevVal, result);
        break;
    case 2: _DecodeNHelper<2>(codesIn, vintsIn, commonValue, prevVal, result);
        break;
    case 3: _DecodeNHelper<3>(codesIn, vintsIn, commonValue, prevVal, result);
        break;
    };

    return numInts;
}